

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

int default_import_callback
              (void *ctx,char *dir,char *file,char **found_here_cptr,char **buf,size_t *buflen)

{
  ImportStatus IVar1;
  size_type sVar2;
  undefined8 *in_RCX;
  JsonnetVm *in_RDX;
  char *in_RDI;
  undefined8 *in_R8;
  string *in_stack_000000a8;
  string *in_stack_000000b0;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  string *in_stack_000000c8;
  char *err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jpaths;
  ImportStatus status;
  string err_msg;
  string found_here;
  string input;
  JsonnetVm *vm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe20;
  ImportStatus in_stack_fffffffffffffe24;
  reference in_stack_fffffffffffffe28;
  JsonnetVm *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  allocator<char> local_171;
  string local_170 [32];
  undefined4 local_150;
  allocator<char> local_149;
  string local_148 [32];
  char *local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  allocator<char> local_101;
  string local_100 [55];
  allocator<char> local_c9;
  string local_c8 [36];
  ImportStatus local_a4;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  char *local_40;
  undefined8 *local_30;
  undefined8 *local_28;
  JsonnetVm *local_20;
  int local_4;
  
  local_40 = in_RDI;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  IVar1 = try_path(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                   in_stack_000000a8);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a4 = IVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(IVar1,in_stack_fffffffffffffe60),in_stack_fffffffffffffe58);
  do {
    if (local_a4 != IMPORT_STATUS_FILE_NOT_FOUND) {
      if (local_a4 == IMPORT_STATUS_IO_ERROR) {
        pcVar3 = from_string_nonull(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        *local_30 = pcVar3;
        local_4 = 1;
      }
      else {
        if (local_a4 != IMPORT_STATUS_OK) {
          __assert_fail("status == IMPORT_STATUS_OK",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/libjsonnet.cpp"
                        ,0x137,
                        "int default_import_callback(void *, const char *, const char *, char **, char **, size_t *)"
                       );
        }
        pcVar3 = from_string(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        *local_28 = pcVar3;
        pcVar3 = from_string_nonull(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        *local_30 = pcVar3;
        local_4 = 0;
      }
LAB_002873c5:
      local_150 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      return local_4;
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_120);
    if (sVar2 == 0) {
      local_128 = "no match locally or in the Jsonnet library paths.";
      pcVar3 = "no match locally or in the Jsonnet library paths.";
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar3,
                 local_40,in_stack_fffffffffffffe40);
      pcVar3 = from_string_nonull(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      *local_30 = pcVar3;
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_149);
      local_4 = 1;
      goto LAB_002873c5;
    }
    in_stack_fffffffffffffe28 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::back(in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe30 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe24 =
         try_path(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                  in_stack_000000a8);
    local_a4 = in_stack_fffffffffffffe24;
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x287266);
  } while( true );
}

Assistant:

static int default_import_callback(void *ctx, const char *dir, const char *file,
                                   char **found_here_cptr, char **buf, size_t *buflen)
{
    auto *vm = static_cast<JsonnetVm *>(ctx);

    std::string input, found_here, err_msg;

    ImportStatus status = try_path(dir, file, input, found_here, err_msg);

    std::vector<std::string> jpaths(vm->jpaths);

    // If not found, try library search path.
    while (status == IMPORT_STATUS_FILE_NOT_FOUND) {
        if (jpaths.size() == 0) {
            const char *err = "no match locally or in the Jsonnet library paths.";
            *buf = from_string_nonull(vm, err, buflen);
            return 1;  // failure
        }
        status = try_path(jpaths.back(), file, input, found_here, err_msg);
        jpaths.pop_back();
    }

    if (status == IMPORT_STATUS_IO_ERROR) {
        *buf = from_string_nonull(vm, err_msg, buflen);
        return 1;  // failure
    }

    assert(status == IMPORT_STATUS_OK);
    *found_here_cptr = from_string(vm, found_here);
    *buf = from_string_nonull(vm, input, buflen);
    return 0;  // success
}